

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O2

int cubeb_stream_register_device_changed_callback
              (cubeb_stream *stream,cubeb_device_changed_callback device_changed_callback)

{
  _func_int_cubeb_stream_ptr_cubeb_device_changed_callback *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  if (stream == (cubeb_stream *)0x0) {
    iVar1 = -3;
  }
  else {
    UNRECOVERED_JUMPTABLE = stream->context->ops->stream_register_device_changed_callback;
    if (UNRECOVERED_JUMPTABLE != (_func_int_cubeb_stream_ptr_cubeb_device_changed_callback *)0x0) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(stream,device_changed_callback);
      return iVar1;
    }
    iVar1 = -4;
  }
  return iVar1;
}

Assistant:

int
cubeb_stream_register_device_changed_callback(
    cubeb_stream * stream,
    cubeb_device_changed_callback device_changed_callback)
{
  if (!stream) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if (!stream->context->ops->stream_register_device_changed_callback) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  return stream->context->ops->stream_register_device_changed_callback(
      stream, device_changed_callback);
}